

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_shexp.hpp
# Opt level: O0

int anon_unknown.dwarf_2c4d5::loadlut_cpu(void)

{
  bool bVar1;
  byte bVar2;
  undefined8 *puVar3;
  reference pvVar4;
  void *this;
  float *pfVar5;
  reference pvVar6;
  float fVar7;
  float fVar8;
  double dVar9;
  float r;
  float target_magn;
  float ratio;
  int i_2;
  int current_id;
  int i_1;
  int j;
  float s;
  int i;
  ifstream fin;
  __cxx11 local_3058 [32];
  string local_3038 [8];
  string filename;
  float local_3018 [2];
  float magn [1024];
  float b [1024];
  float a [1024];
  int n;
  
  github111116::ConsoleLogger::log<char[30]>
            (&console,(char (*) [30])"loading log & OL lut (CPU)...");
  std::__cxx11::to_string(local_3058,0xf);
  std::operator+((char *)local_3038,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"../lut/lut");
  std::__cxx11::string::~string((string *)local_3058);
  std::ifstream::ifstream(&s,local_3038,_S_in);
  bVar2 = std::ios::operator!((ios *)((long)&s + *(long *)(_s + -0x18)));
  if ((bVar2 & 1) == 0) {
    for (j = 0; j < 0x400; j = j + 1) {
      i_1 = 0;
      for (current_id = 0; current_id < 0xf; current_id = current_id + 1) {
        pvVar4 = std::vector<SymmSH<15>,_std::allocator<SymmSH<15>_>_>::operator[]
                           ((vector<SymmSH<15>,_std::allocator<SymmSH<15>_>_> *)
                            (anonymous_namespace)::log_lut,(long)j);
        std::istream::operator>>(&s,pvVar4->a + current_id);
        if (0 < current_id) {
          pvVar4 = std::vector<SymmSH<15>,_std::allocator<SymmSH<15>_>_>::operator[]
                             ((vector<SymmSH<15>,_std::allocator<SymmSH<15>_>_> *)
                              (anonymous_namespace)::log_lut,(long)j);
          fVar7 = pvVar4->a[current_id];
          pvVar4 = std::vector<SymmSH<15>,_std::allocator<SymmSH<15>_>_>::operator[]
                             ((vector<SymmSH<15>,_std::allocator<SymmSH<15>_>_> *)
                              (anonymous_namespace)::log_lut,(long)j);
          i_1 = (int)(fVar7 * pvVar4->a[current_id] + (float)i_1);
        }
      }
      dVar9 = std::sqrt((double)(ulong)(uint)i_1);
      local_3018[j] = SUB84(dVar9,0);
      this = (void *)std::istream::operator>>(&s,b + (long)j + 0x3fe);
      std::istream::operator>>(this,magn + (long)j + 0x3fe);
    }
    (anonymous_namespace)::max_magn = 0.0;
    for (i_2 = 0; i_2 < 0x400; i_2 = i_2 + 1) {
      pfVar5 = std::max<float>(&(anonymous_namespace)::max_magn,local_3018 + i_2);
      (anonymous_namespace)::max_magn = *pfVar5;
    }
    ratio = 0.0;
    for (target_magn = 0.0; (int)target_magn < 0x400; target_magn = (float)((int)target_magn + 1)) {
      fVar7 = lerp<float>(local_3018[0],(anonymous_namespace)::max_magn,
                          (float)(int)target_magn / 1023.0);
      while( true ) {
        bVar1 = false;
        if ((int)ratio < 0x3ff) {
          bVar1 = local_3018[(int)ratio + 1] <= fVar7 && fVar7 != local_3018[(int)ratio + 1];
        }
        if (!bVar1) break;
        ratio = (float)((int)ratio + 1);
      }
      fVar7 = (fVar7 - local_3018[(int)ratio]) /
              (magn[(long)(int)ratio + -1] - local_3018[(int)ratio]);
      fVar8 = lerp<float>(b[(long)(int)ratio + 0x3fe],b[(long)(int)ratio + 0x3ff],fVar7);
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(anonymous_namespace)::a_lut,
                          (long)(int)target_magn);
      *pvVar6 = fVar8;
      fVar7 = lerp<float>(magn[(long)(int)ratio + 0x3fe],magn[(long)(int)ratio + 0x3ff],fVar7);
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(anonymous_namespace)::b_lut,
                          (long)(int)target_magn);
      *pvVar6 = fVar7;
    }
    std::ifstream::~ifstream(&s);
    std::__cxx11::string::~string(local_3038);
    return 0;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "cannot open lut";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

int loadlut_cpu()
	{
		const int n = shorder;
		console.log("loading log & OL lut (CPU)...");
		float a[n_entry], b[n_entry], magn[n_entry];
		// read lut from file
		std::string filename = "../lut/lut" + std::to_string(n);
		std::ifstream fin(filename);
		if (!fin) throw "cannot open lut";
		for (int i=0; i<n_entry; ++i)
		{
			// calculate magnitude of f_hat (f without DC component)
			float s = 0;
			for (int j=0; j<n; ++j) {
				fin >> log_lut[i].a[j];
				if (j>0)
					s += log_lut[i].a[j] * log_lut[i].a[j];
			}
			magn[i] = sqrt(s);
			fin >> a[i] >> b[i];
		}
		// magnitude is increasing then decreasing
		max_magn = 0;
		for (int i=0; i<n_entry; ++i)
			max_magn = std::max(max_magn, magn[i]);
		// convert AB_lut from angle-indexed to magnitude-indexed
		int current_id = 0;
		for (int i=0; i<n_entry; ++i)
		{
			float ratio = (float)i / (n_entry-1);
			float target_magn = lerp(magn[0], max_magn, ratio);
			while (current_id < n_entry-1 and target_magn > magn[current_id+1])
				current_id += 1;
			float r = (target_magn - magn[current_id]) / (magn[current_id+1] - magn[current_id]);
			a_lut[i] = lerp(a[current_id], a[current_id+1], r);
			b_lut[i] = lerp(b[current_id], b[current_id+1], r);
		}
		return 0;
	}